

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O2

pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> * __thiscall
pstore::transaction_base::alloc_rw<unsigned_char,void>
          (pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_>
           *__return_storage_ptr__,transaction_base *this,size_t num)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<void> local_38;
  pair<std::shared_ptr<void>,_pstore::address> result;
  
  alloc_rw(&result,this,num,1);
  std::static_pointer_cast<unsigned_char,void>(&local_38);
  _Var1._M_pi = local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).a_.a_ = result.second.a_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto alloc_rw (std::size_t const num = 1)
            -> std::pair<std::shared_ptr<Ty>, typed_address<Ty>> {
            auto result = this->alloc_rw (sizeof (Ty) * num, alignof (Ty));
            return {std::static_pointer_cast<Ty> (result.first), typed_address<Ty> (result.second)};
        }